

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.hpp
# Opt level: O3

string * __thiscall
clipp::usage_lines::param_label_abi_cxx11_
          (string *__return_storage_ptr__,usage_lines *this,parameter *p,context *cur)

{
  uint uVar1;
  group *pgVar2;
  pointer pcVar3;
  pointer pbVar4;
  pointer pbVar5;
  pointer pcVar6;
  bool bVar7;
  long *plVar8;
  string *psVar9;
  undefined8 *puVar10;
  long *plVar11;
  pointer pcVar12;
  byte bVar13;
  uint uVar14;
  ulong uVar15;
  byte bVar16;
  bool bVar17;
  _Alloc_hider local_b8;
  size_type local_b0;
  char local_a8;
  undefined7 uStack_a7;
  undefined8 uStack_a0;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  string *local_78;
  size_type *local_70;
  string *local_68;
  size_type *local_60;
  string *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pcVar12 = (cur->pos).stack_.
            super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pgVar2 = pcVar12[-1].parent;
  pcVar3 = (pgVar2->children_).
           super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  bVar17 = true;
  if (((1 < (ulong)(((long)(pgVar2->children_).
                           super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pcVar3 >> 3) *
                   0xf83e0f83e0f83e1)) && ((p->super_token<clipp::parameter>).blocking_ == true)) &&
     ((cur->pos).stack_.
      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
      ._M_impl.super__Vector_impl_data._M_start != pcVar12)) {
    bVar17 = pcVar12[-1].cur._M_current != pcVar3;
  }
  bVar16 = this->ommitOutermostSurrounders_ ^ 1U | cur->outermost != pgVar2;
  if (pgVar2->exclusive_ == false) {
    bVar13 = (p->required_ ^ 1U) & bVar17 & bVar16;
  }
  else {
    bVar13 = 0;
  }
  bVar16 = bVar16 & (p->super_token<clipp::parameter>).repeatable_;
  local_b0 = 0;
  local_a8 = '\0';
  local_b8._M_p = &local_a8;
  if (bVar16 == 1) {
    std::__cxx11::string::_M_append
              ((char *)&local_b8,(ulong)(this->fmt_).repeatPre_._M_dataplus._M_p);
  }
  if (bVar13 != 0) {
    std::__cxx11::string::_M_append
              ((char *)&local_b8,(ulong)(this->fmt_).optionPre_._M_dataplus._M_p);
  }
  pbVar4 = (p->flags_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar5 = (p->flags_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar4 == pbVar5) {
    if ((p->label_)._M_string_length == 0) {
      if ((this->fmt_).emptyLabel_._M_string_length == 0) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
        if (local_b8._M_p == &local_a8) {
          return __return_storage_ptr__;
        }
        operator_delete(local_b8._M_p);
        return __return_storage_ptr__;
      }
      std::operator+(&local_50,&(this->fmt_).labelPre_,&(this->fmt_).emptyLabel_);
      puVar10 = (undefined8 *)
                std::__cxx11::string::_M_append
                          ((char *)&local_50,(ulong)(this->fmt_).labelPst_._M_dataplus._M_p);
      local_98 = &local_88;
      plVar8 = puVar10 + 2;
      if ((long *)*puVar10 == plVar8) {
        local_88 = *plVar8;
        lStack_80 = puVar10[3];
      }
      else {
        local_88 = *plVar8;
        local_98 = (long *)*puVar10;
      }
      local_90 = puVar10[1];
      *puVar10 = plVar8;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_98);
    }
    else {
      std::operator+(&local_50,&(this->fmt_).labelPre_,&p->label_);
      plVar8 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_50,(ulong)(this->fmt_).labelPst_._M_dataplus._M_p);
      local_98 = &local_88;
      plVar11 = plVar8 + 2;
      if ((long *)*plVar8 == plVar11) {
        local_88 = *plVar11;
        lStack_80 = plVar8[3];
      }
      else {
        local_88 = *plVar11;
        local_98 = (long *)*plVar8;
      }
      local_90 = plVar8[1];
      *plVar8 = (long)plVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_98);
    }
    if (local_98 != &local_88) {
      operator_delete(local_98);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    goto LAB_0013d092;
  }
  uVar1 = (this->fmt_).maxAltInUsage_;
  uVar14 = (uint)((ulong)((long)pbVar5 - (long)pbVar4) >> 5);
  if ((int)uVar1 < (int)uVar14) {
    uVar14 = uVar1;
  }
  local_78 = __return_storage_ptr__;
  if ((int)uVar14 < 2 || bVar13 != 0) {
LAB_0013cd79:
    bVar17 = false;
  }
  else {
    if (cur->linestart == true) {
      pcVar12 = (cur->pos).stack_.
                super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pcVar6 = (cur->pos).stack_.
               super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pcVar12 != pcVar6) {
        do {
          if ((pcVar12->cur)._M_current + 1 != (pcVar12->end)._M_current) goto LAB_0013ce40;
          pcVar12 = pcVar12 + 1;
        } while (pcVar12 != pcVar6);
        if ((pcVar6[-1].cur._M_current)->type_ != group) goto LAB_0013cd79;
      }
    }
LAB_0013ce40:
    bVar17 = true;
    std::__cxx11::string::_M_append
              ((char *)&local_b8,(ulong)(this->fmt_).alternFlagPre_._M_dataplus._M_p);
  }
  if (0 < (int)uVar14) {
    local_68 = &(this->fmt_).altGroupSep_;
    local_70 = &(this->fmt_).altGroupSep_._M_string_length;
    local_58 = &(this->fmt_).flagSep_;
    local_60 = &(this->fmt_).flagSep_._M_string_length;
    uVar15 = 0;
    bVar7 = false;
    do {
      if (bVar7) {
        if (cur->linestart == true) {
          pcVar12 = (cur->pos).stack_.
                    super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pcVar6 = (cur->pos).stack_.
                   super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (pcVar12 == pcVar6) goto LAB_0013cef2;
          do {
            if ((pcVar12->cur)._M_current + 1 != (pcVar12->end)._M_current) goto LAB_0013cef2;
            pcVar12 = pcVar12 + 1;
          } while (pcVar12 != pcVar6);
          psVar9 = local_68;
          if ((pcVar6[-1].cur._M_current)->type_ == group) goto LAB_0013cef2;
        }
        else {
LAB_0013cef2:
          psVar9 = local_58;
        }
        std::__cxx11::string::_M_append((char *)&local_b8,(ulong)(psVar9->_M_dataplus)._M_p);
      }
      std::__cxx11::string::_M_append
                ((char *)&local_b8,
                 (ulong)(p->flags_).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar15]._M_dataplus._M_p);
      uVar15 = uVar15 + 1;
      bVar7 = true;
    } while (uVar15 != uVar14);
  }
  __return_storage_ptr__ = local_78;
  if (bVar17) {
    std::__cxx11::string::_M_append
              ((char *)&local_b8,(ulong)(this->fmt_).alternFlagPst_._M_dataplus._M_p);
  }
LAB_0013d092:
  if (bVar13 != 0) {
    std::__cxx11::string::_M_append
              ((char *)&local_b8,(ulong)(this->fmt_).optionPst_._M_dataplus._M_p);
  }
  if (bVar16 != 0) {
    std::__cxx11::string::_M_append
              ((char *)&local_b8,(ulong)(this->fmt_).repeatPst_._M_dataplus._M_p);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (local_b8._M_p == &local_a8) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_a7,local_a8);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_a0;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_b8._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_a7,local_a8);
  }
  __return_storage_ptr__->_M_string_length = local_b0;
  return __return_storage_ptr__;
}

Assistant:

string param_label(const parameter& p, const context& cur) const
    {
        const auto& parent = cur.pos.parent();

        const bool startsOptionalSequence =
            parent.size() > 1 && p.blocking() && cur.pos.is_first_in_parent();

        const bool outermost =
            ommitOutermostSurrounders_ && cur.outermost == &parent;

        const bool showopt = !cur.is_alternative() && !p.required()
            && !startsOptionalSequence && !outermost;

        const bool showrep = p.repeatable() && !outermost;

        string lbl;

        if(showrep) lbl += fmt_.repeat_prefix();
        if(showopt) lbl += fmt_.optional_prefix();

        const auto& flags = p.flags();
        if(!flags.empty()) {
            const int n = std::min(fmt_.max_flags_per_param_in_usage(),
                                   int(flags.size()));

            const bool surrAlt = n > 1 && !showopt && !cur.is_singleton();

            if(surrAlt) lbl += fmt_.alternative_flags_prefix();
            bool sep = false;
            for(int i = 0; i < n; ++i) {
                if(sep) {
                    if(cur.is_singleton())
                        lbl += fmt_.alternative_group_separator();
                    else
                        lbl += fmt_.flag_separator();
                }
                lbl += flags[i];
                sep = true;
            }
            if(surrAlt) lbl += fmt_.alternative_flags_postfix();
        }
        else {
             if(!p.label().empty()) {
                 lbl += fmt_.label_prefix()
                     + p.label()
                     + fmt_.label_postfix();
             } else if(!fmt_.empty_label().empty()) {
                 lbl += fmt_.label_prefix()
                     + fmt_.empty_label()
                     + fmt_.label_postfix();
             } else {
                 return "";
             }
        }

        if(showopt) lbl += fmt_.optional_postfix();
        if(showrep) lbl += fmt_.repeat_postfix();

        return lbl;
    }